

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cc
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  undefined1 auVar9 [16];
  long lVar10;
  
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = &PTR_createIterator_00103d30;
  puVar5 = (undefined8 *)operator_new__(0x14);
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined4 *)(puVar5 + 2) = 0;
  puVar4[1] = puVar5;
  auVar1 = _DAT_00102020;
  lVar7 = 0;
  auVar9 = _DAT_00102010;
  do {
    if (SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffb) {
      *(int *)((long)puVar5 + lVar7 * 4) = (int)lVar7;
      *(int *)((long)puVar5 + lVar7 * 4 + 4) = (int)lVar7 + 1;
    }
    lVar7 = lVar7 + 2;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar10 + 2;
  } while (lVar7 != 6);
  *(undefined4 *)(puVar4 + 2) = 5;
  plVar6 = (long *)operator_new(0x18);
  *plVar6 = (long)&PTR_first_00103d80;
  plVar6[1] = (long)puVar4;
  *(undefined4 *)(plVar6 + 2) = 0;
  iVar8 = -1;
  do {
    iVar3 = (**(code **)(*plVar6 + 0x18))(plVar6);
    iVar8 = iVar8 + 1;
    if (iVar8 != iVar3) {
      __assert_fail("value == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                    ,0xe,"int main()");
    }
    (**(code **)(*plVar6 + 8))(plVar6);
    cVar2 = (**(code **)(*plVar6 + 0x10))(plVar6);
  } while (cVar2 == '\0');
  (**(code **)*plVar6)(plVar6);
  iVar8 = (**(code **)(*plVar6 + 0x18))(plVar6);
  if (iVar8 != 0) {
    __assert_fail("value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                  ,0x15,"int main()");
  }
  return 0;
}

Assistant:

int main() {
  ConcreteAggregate* list = new ConcreteAggregate(5);
  Iterator* iterator = list->createIterator();
  int value;

  for (int i = 0; !iterator->isDone(); iterator->next()) {
    value = iterator->currentItem();
    assert(value == i);
    i++;
  }

  iterator->first();

  value = iterator->currentItem();
  assert(value == 0);
}